

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_memprof.c
# Opt level: O0

void memprof_write_func(memprof *mp,uint8_t aevent)

{
  GCfunc *fn_00;
  lua_State *L_00;
  cTValue *nextframe;
  undefined1 in_SIL;
  long *in_RDI;
  lj_wbuf *unaff_retaddr;
  GCfunc *fn;
  cTValue *frame;
  lua_State *L;
  lj_wbuf *out;
  uint8_t aevent_00;
  undefined7 in_stack_fffffffffffffff0;
  
  fn_00 = (GCfunc *)(ulong)*(uint *)(*in_RDI + 0x18c);
  L_00 = (lua_State *)(*(long *)&(fn_00->c).pc + -8);
  nextframe = (cTValue *)(ulong)(L_00->nextgc).gcptr32;
  aevent_00 = (uint8_t)((ulong)(in_RDI + 2) >> 0x38);
  if (*(char *)((long)&(nextframe->field_2).it + 2) == '\0') {
    memprof_write_lfunc((lj_wbuf *)CONCAT17(in_SIL,in_stack_fffffffffffffff0),aevent_00,fn_00,L_00,
                        nextframe);
  }
  else if (*(byte *)((long)&(nextframe->field_2).it + 2) < 2) {
    if (*(char *)((long)&(nextframe->field_2).it + 2) == '\x01') {
      memprof_write_cfunc((lj_wbuf *)CONCAT17(in_SIL,in_stack_fffffffffffffff0),aevent_00,fn_00,L_00
                          ,(uint32_t *)&nextframe->u64);
    }
  }
  else {
    memprof_write_ffunc(unaff_retaddr,(uint8_t)((ulong)in_RDI >> 0x38),
                        (GCfunc *)CONCAT17(in_SIL,in_stack_fffffffffffffff0),
                        (lua_State *)(in_RDI + 2),(cTValue *)fn_00,(uint32_t *)L_00);
  }
  return;
}

Assistant:

static void memprof_write_func(struct memprof *mp, uint8_t aevent)
{
  struct lj_wbuf *out = &mp->out;
  lua_State *L = gco2th(gcref(mp->g->mem_L));
  cTValue *frame = L->base - 1;
  GCfunc *fn = frame_func(frame);

  if (isluafunc(fn))
    memprof_write_lfunc(out, aevent, fn, L, NULL);
  else if (isffunc(fn))
    memprof_write_ffunc(out, aevent, fn, L, frame, &mp->lib_adds);
  else if (iscfunc(fn))
    memprof_write_cfunc(out, aevent, fn, L, &mp->lib_adds);
  else
    lj_assertL(0, "unknown function type to write by memprof");
}